

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O2

void __thiscall HighsTaskExecutor::stopWorkerThreads(HighsTaskExecutor *this,bool blocking)

{
  __int_type_conflict1 _Var1;
  pointer puVar2;
  HighsSplitDeque *pHVar3;
  pointer ptVar4;
  long *plVar5;
  thread *workerThread;
  pointer ptVar6;
  unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *workerDeque;
  pointer puVar7;
  
  plVar5 = (long *)globalExecutorHandle();
  if (*plVar5 != 0) {
    LOCK();
    _Var1 = (this->hasStopped)._M_base._M_i;
    (this->hasStopped)._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) {
      puVar2 = (this->workerDeques).
               super__Vector_base<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = (this->workerDeques).
                    super__Vector_base<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1
          ) {
        pHVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                 .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl;
        (pHVar3->stealerData).injectedTask = (HighsTask *)0x0;
        HighsBinarySemaphore::release(&(pHVar3->stealerData).semaphore);
      }
      if ((blocking) && ((char)plVar5[1] == '\x01')) {
        ptVar4 = (this->workerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ptVar6 = (this->workerThreads).
                      super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start; ptVar6 != ptVar4; ptVar6 = ptVar6 + 1) {
          std::thread::join();
        }
      }
      else {
        ptVar4 = (this->workerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ptVar6 = (this->workerThreads).
                      super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start; ptVar6 != ptVar4; ptVar6 = ptVar6 + 1) {
          std::thread::detach();
        }
      }
    }
  }
  return;
}

Assistant:

void stopWorkerThreads(bool blocking = false) {
    // Check if stop has been called already.
    auto& executorHandle = threadLocalExecutorHandle();
    if (executorHandle.ptr == nullptr || hasStopped.exchange(true)) return;

    // now inject the null task as termination signal to every worker
    for (auto& workerDeque : workerDeques) {
      workerDeque->injectTaskAndNotify(nullptr);
    }

    // only block if called on main thread, otherwise deadlock may occur
    if (blocking && executorHandle.isMain) {
      for (auto& workerThread : workerThreads) {
        workerThread.join();
      }
    } else {
      for (auto& workerThread : workerThreads) {
        workerThread.detach();
      }
    }
  }